

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.h
# Opt level: O2

void __thiscall
Imf_2_5::TypedDeepImageChannel<float>::moveSamplesToNewBuffer
          (TypedDeepImageChannel<float> *this,uint *oldNumSamples,uint *newNumSamples,
          size_t *newSampleListPositions)

{
  uint uVar1;
  float *pfVar2;
  size_t sVar3;
  float **ppfVar4;
  SampleCountChannel *pSVar5;
  float *pfVar6;
  float *pfVar7;
  size_t i;
  size_t sVar8;
  uint j;
  ulong uVar9;
  uint j_1;
  ulong uVar10;
  
  pfVar2 = this->_sampleBuffer;
  pSVar5 = DeepImageChannel::sampleCounts(&this->super_DeepImageChannel);
  pfVar6 = (float *)operator_new__(-(ulong)(pSVar5->_sampleBufferSize >> 0x3e != 0) |
                                   pSVar5->_sampleBufferSize << 2);
  this->_sampleBuffer = pfVar6;
  sVar3 = (this->super_DeepImageChannel).super_ImageChannel._numPixels;
  for (sVar8 = 0; sVar8 != sVar3; sVar8 = sVar8 + 1) {
    ppfVar4 = this->_sampleListPointers;
    pfVar7 = this->_sampleBuffer + newSampleListPositions[sVar8];
    pfVar6 = ppfVar4[sVar8];
    uVar9 = (ulong)oldNumSamples[sVar8];
    uVar1 = newNumSamples[sVar8];
    if (uVar1 < oldNumSamples[sVar8]) {
      for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
        pfVar7[uVar9] = pfVar6[uVar9];
      }
    }
    else {
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        pfVar7[uVar10] = pfVar6[uVar10];
      }
      for (; uVar1 != uVar9; uVar9 = uVar9 + 1) {
        pfVar7[uVar9] = 0.0;
      }
    }
    ppfVar4[sVar8] = pfVar7;
  }
  if (pfVar2 != (float *)0x0) {
    operator_delete__(pfVar2);
    return;
  }
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::moveSamplesToNewBuffer
    (const unsigned int * oldNumSamples,
     const unsigned int * newNumSamples,
     const size_t * newSampleListPositions)
{
    //
    // Allocate a new sample buffer for this channel.
    // Copy the sample lists for all pixels into the new buffer.
    // Then delete the old sample buffer.
    //
    // oldNumSamples            Number of samples in each sample list in the
    //                          old sample buffer.
    //
    // newNumSamples            Number of samples in each sample list in
    //                          the new sample buffer.  If the new number
    //                          of samples is larger than the old number of
    //                          samples for a given sample list, then the
    //                          end of the new sample list is filled with
    //                          zeroes.  If the new number of samples is
    //                          smaller than the old one, then samples at
    //                          the end of the old sample list are discarded.
    //
    // newSampleListPositions   The positions of the new sample lists in the
    //                          new sample buffer.
    //

    T * oldSampleBuffer = _sampleBuffer;
    _sampleBuffer = new T [sampleCounts().sampleBufferSize()];

    for (size_t i = 0; i < numPixels(); ++i)
    {
        T * oldSampleList = _sampleListPointers[i];
        T * newSampleList = _sampleBuffer + newSampleListPositions[i];

        if (oldNumSamples[i] > newNumSamples[i])
        {
            for (unsigned int j = 0; j < newNumSamples[i]; ++j)
                newSampleList[j] = oldSampleList[j];
        }
        else
        {
            for (unsigned int j = 0; j < oldNumSamples[i]; ++j)
                newSampleList[j] = oldSampleList[j];

            for (unsigned int j = oldNumSamples[i]; j < newNumSamples[i]; ++j)
                newSampleList[j] = 0;
        }

        _sampleListPointers[i] = newSampleList;
    }

    delete [] oldSampleBuffer;
}